

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

int SetUnion(char *s1,char *s2)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)size;
  if (size < 1) {
    uVar2 = uVar3;
  }
  iVar1 = 0;
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    if ((s2[uVar3] != '\0') && (s1[uVar3] == '\0')) {
      s1[uVar3] = '\x01';
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

int SetUnion(char *s1, char *s2)
{
  int i, progress;
  progress = 0;
  for(i=0; i<size; i++){
    if( s2[i]==0 ) continue;
    if( s1[i]==0 ){
      progress = 1;
      s1[i] = 1;
    }
  }
  return progress;
}